

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O0

Vec_Int_t * Abc_NtkWriteMiniMapping(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar3;
  Vec_Int_t *p_00;
  Vec_Str_t *p_01;
  Abc_Obj_t *pAVar4;
  char *pcVar5;
  int *pArray;
  int local_48;
  int nExtra;
  int nFanins;
  int nNodes;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Vec_Str_t *vGates;
  Vec_Int_t *vMapping;
  Vec_Ptr_t *vNodes;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkHasMapping(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkHasMapping(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcMap.c"
                  ,0x33c,"Vec_Int_t *Abc_NtkWriteMiniMapping(Abc_Ntk_t *)");
  }
  p = Abc_NtkDfs(pNtk,0);
  local_48 = 0;
  nExtra = 0;
  for (nNodes = 0; iVar1 = Abc_NtkCiNum(pNtk), nNodes < iVar1; nNodes = nNodes + 1) {
    pAVar3 = Abc_NtkCi(pNtk,nNodes);
    (pAVar3->field_6).iTemp = nExtra;
    nExtra = nExtra + 1;
  }
  for (nNodes = 0; iVar1 = Vec_PtrSize(p), nNodes < iVar1; nNodes = nNodes + 1) {
    pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(p,nNodes);
    (pAVar3->field_6).iTemp = nExtra;
    iVar1 = Abc_ObjFaninNum(pAVar3);
    local_48 = iVar1 + local_48;
    nExtra = nExtra + 1;
  }
  iVar1 = Abc_NtkNodeNum(pNtk);
  iVar2 = Abc_NtkCoNum(pNtk);
  p_00 = Vec_IntAlloc(iVar1 + local_48 + iVar2 + 0x2714);
  iVar1 = Abc_NtkCiNum(pNtk);
  Vec_IntPush(p_00,iVar1);
  iVar1 = Abc_NtkCoNum(pNtk);
  Vec_IntPush(p_00,iVar1);
  iVar1 = Abc_NtkNodeNum(pNtk);
  Vec_IntPush(p_00,iVar1);
  iVar1 = Abc_NtkLatchNum(pNtk);
  Vec_IntPush(p_00,iVar1);
  p_01 = Vec_StrAlloc(10000);
  for (nNodes = 0; iVar1 = Vec_PtrSize(p), nNodes < iVar1; nNodes = nNodes + 1) {
    pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(p,nNodes);
    iVar1 = Abc_ObjFaninNum(pAVar3);
    Vec_IntPush(p_00,iVar1);
    for (nFanins = 0; iVar1 = Abc_ObjFaninNum(pAVar3), nFanins < iVar1; nFanins = nFanins + 1) {
      pAVar4 = Abc_ObjFanin(pAVar3,nFanins);
      Vec_IntPush(p_00,(pAVar4->field_6).iTemp);
    }
    pcVar5 = Mio_GateReadName((Mio_Gate_t *)(pAVar3->field_5).pData);
    Vec_StrPrintStr(p_01,pcVar5);
    Vec_StrPush(p_01,'\0');
  }
  for (nNodes = 0; iVar1 = Abc_NtkCoNum(pNtk), nNodes < iVar1; nNodes = nNodes + 1) {
    pAVar3 = Abc_NtkCo(pNtk,nNodes);
    pAVar3 = Abc_ObjFanin0(pAVar3);
    Vec_IntPush(p_00,(pAVar3->field_6).iTemp);
  }
  iVar1 = Vec_StrSize(p_01);
  for (nNodes = 0; nNodes < 4 - iVar1 % 4; nNodes = nNodes + 1) {
    Vec_StrPush(p_01,'\0');
  }
  iVar1 = Vec_StrSize(p_01);
  if (iVar1 % 4 != 0) {
    __assert_fail("Vec_StrSize(vGates) % 4 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcMap.c"
                  ,0x35f,"Vec_Int_t *Abc_NtkWriteMiniMapping(Abc_Ntk_t *)");
  }
  iVar1 = Vec_StrSize(p_01);
  pcVar5 = Vec_StrArray(p_01);
  for (nNodes = 0; nNodes < iVar1 / 4; nNodes = nNodes + 1) {
    Vec_IntPush(p_00,*(int *)(pcVar5 + (long)nNodes * 4));
  }
  Vec_PtrFree(p);
  Vec_StrFree(p_01);
  return p_00;
}

Assistant:

Vec_Int_t * Abc_NtkWriteMiniMapping( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Vec_Int_t * vMapping;
    Vec_Str_t * vGates;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, nNodes, nFanins, nExtra, * pArray;
    assert( Abc_NtkHasMapping(pNtk) );
    // collect nodes in the DFS order
    vNodes = Abc_NtkDfs( pNtk, 0 );
    // assign unique numbers
    nNodes = nFanins = 0;
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->iTemp = nNodes++;
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        pObj->iTemp = nNodes++, nFanins += Abc_ObjFaninNum(pObj);
    // allocate attay to store mapping (4 counters + fanins for each node + PO drivers + gate names)
    vMapping = Vec_IntAlloc( 4 + Abc_NtkNodeNum(pNtk) + nFanins + Abc_NtkCoNum(pNtk) + 10000 );
    // write the numbers of CI/CO/Node/FF
    Vec_IntPush( vMapping, Abc_NtkCiNum(pNtk) );
    Vec_IntPush( vMapping, Abc_NtkCoNum(pNtk) );
    Vec_IntPush( vMapping, Abc_NtkNodeNum(pNtk) );
    Vec_IntPush( vMapping, Abc_NtkLatchNum(pNtk) );
    // write the nodes
    vGates = Vec_StrAlloc( 10000 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        Vec_IntPush( vMapping, Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vMapping, pFanin->iTemp );
        // remember this gate (to be added to the mapping later)
        Vec_StrPrintStr( vGates, Mio_GateReadName((Mio_Gate_t *)pObj->pData) );
        Vec_StrPush( vGates, '\0' );
    }
    // write the COs literals
    Abc_NtkForEachCo( pNtk, pObj, i )
        Vec_IntPush( vMapping, Abc_ObjFanin0(pObj)->iTemp );
    // finish off the array
    nExtra = 4 - Vec_StrSize(vGates) % 4;
    for ( i = 0; i < nExtra; i++ )
        Vec_StrPush( vGates, '\0' );
    // add gates to the array
    assert( Vec_StrSize(vGates) % 4 == 0 );
    nExtra = Vec_StrSize(vGates) / 4;
    pArray = (int *)Vec_StrArray(vGates);
    for ( i = 0; i < nExtra; i++ )
        Vec_IntPush( vMapping, pArray[i] );
    // cleanup and return
    Vec_PtrFree( vNodes );
    Vec_StrFree( vGates );
    return vMapping;
}